

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringhelper.cpp
# Opt level: O0

void strcpy_safe(char *destination,char *source,int maxLength)

{
  int local_20;
  int i;
  int maxLength_local;
  char *source_local;
  char *destination_local;
  
  for (local_20 = 0;
      (local_20 < maxLength && (destination[local_20] = source[local_20], source[local_20] != '\0'))
      ; local_20 = local_20 + 1) {
  }
  destination[local_20] = '\0';
  return;
}

Assistant:

void strcpy_safe( char *destination, char const*source, int maxLength ) {
    int i = 0;
    for( i = 0; i < maxLength; i++ ) {
        destination[i] = source[i];
        if( source[i] == 0 ) {
            break;
        }
    }
    destination[i] = 0;
}